

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

void __thiscall
chrono::curiosity::Curiosity::Create
          (Curiosity *this,CuriosityChassisType chassis_type,CuriosityWheelType wheel_type)

{
  shared_ptr<chrono::ChMaterialSurface> *__args_3;
  long lVar1;
  undefined1 *mv;
  __shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2> local_100;
  undefined4 local_f0;
  CuriosityWheelType wheel_type_local;
  ChQuaternion<double> steer_rot;
  CuriosityChassisType chassis_type_local;
  ChFrame<double> local_b8;
  
  __args_3 = &this->m_default_material;
  wheel_type_local = wheel_type;
  chassis_type_local = chassis_type;
  std::
  make_shared<chrono::curiosity::CuriosityChassis,char_const(&)[8],chrono::curiosity::CuriosityChassisType&,std::shared_ptr<chrono::ChMaterialSurface>&>
            ((char (*) [8])&local_b8,(CuriosityChassisType *)0x1847bc,
             (shared_ptr<chrono::ChMaterialSurface> *)&chassis_type_local);
  std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_chassis).
              super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> *)
             &local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.coord);
  mv = wheel_pos;
  for (lVar1 = 0x20; lVar1 != 0x80; lVar1 = lVar1 + 0x10) {
    ChFrame<double>::ChFrame(&local_b8,(ChVector<double> *)mv,(ChQuaternion<double> *)&QUNIT);
    std::
    make_shared<chrono::curiosity::CuriosityWheel,char_const(&)[6],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::curiosity::CuriosityWheelType&>
              ((char (*) [6])&steer_rot,(ChFrame<double> *)0x1847ee,
               (shared_ptr<chrono::ChMaterialSurface> *)&local_b8,
               (CuriosityWheelType *)&this->m_wheel_material);
    std::__shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)((this->m_wheels)._M_elems + -2) + lVar1),
               (__shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2> *)
               &steer_rot);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(steer_rot.m_data + 1));
    mv = (undefined1 *)((long)mv + 0x18);
  }
  chrono::Q_from_AngZ(3.141592653589793);
  ChFrame<double>::ChFrame(&local_b8,(ChVector<double> *)&VNULL,&steer_rot);
  ChFrame<double>::operator=
            (&(((this->m_wheels)._M_elems[1].
                super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CuriosityPart).m_mesh_xform,&local_b8);
  chrono::Q_from_AngZ(3.141592653589793);
  ChFrame<double>::ChFrame(&local_b8,(ChVector<double> *)&VNULL,&steer_rot);
  ChFrame<double>::operator=
            (&(((this->m_wheels)._M_elems[3].
                super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CuriosityPart).m_mesh_xform,&local_b8);
  chrono::Q_from_AngZ(3.141592653589793);
  ChFrame<double>::ChFrame(&local_b8,(ChVector<double> *)&VNULL,&steer_rot);
  ChFrame<double>::operator=
            (&(((this->m_wheels)._M_elems[5].
                super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CuriosityPart).m_mesh_xform,&local_b8);
  ChFrame<double>::ChFrame
            (&local_b8,(ChVector<double> *)cr_rel_pos_lf,(ChQuaternion<double> *)&QUNIT);
  local_100._M_ptr._0_4_ = 0;
  std::
  make_shared<chrono::curiosity::CuriosityRocker,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((char (*) [9])&steer_rot,(ChFrame<double> *)"rocker_L",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_b8,(int *)__args_3);
  std::__shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2> *)
             &this->m_rockers,
             (__shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2> *)
             &steer_rot);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(steer_rot.m_data + 1));
  ChFrame<double>::ChFrame
            (&local_b8,(ChVector<double> *)cr_rel_pos_rf,(ChQuaternion<double> *)&QUNIT);
  local_100._M_ptr._0_4_ = 1;
  std::
  make_shared<chrono::curiosity::CuriosityRocker,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((char (*) [9])&steer_rot,(ChFrame<double> *)"rocker_R",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_b8,(int *)__args_3);
  std::__shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_rockers)._M_elems[1].
              super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2> *)
             &steer_rot);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(steer_rot.m_data + 1));
  ChFrame<double>::ChFrame
            (&local_b8,(ChVector<double> *)cr_rel_pos_lb,(ChQuaternion<double> *)&QUNIT);
  local_100._M_ptr._0_4_ = 0;
  std::
  make_shared<chrono::curiosity::CuriosityBogie,char_const(&)[8],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((char (*) [8])&steer_rot,(ChFrame<double> *)"bogie_L",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_b8,(int *)__args_3);
  std::__shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2> *)
             &this->m_bogies,
             (__shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2> *)
             &steer_rot);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(steer_rot.m_data + 1));
  ChFrame<double>::ChFrame
            (&local_b8,(ChVector<double> *)cr_rel_pos_rb,(ChQuaternion<double> *)&QUNIT);
  local_100._M_ptr._0_4_ = 1;
  std::
  make_shared<chrono::curiosity::CuriosityBogie,char_const(&)[8],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((char (*) [8])&steer_rot,(ChFrame<double> *)"bogie_R",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_b8,(int *)__args_3);
  std::__shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_bogies)._M_elems[1].
              super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2> *)
             &steer_rot);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(steer_rot.m_data + 1));
  local_b8._vptr_ChFrame = (_func_int **)0x0;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 3.141592653589793;
  chrono::Q_from_Euler123((ChVector *)&steer_rot);
  ChFrame<double>::ChFrame
            (&local_b8,(ChVector<double> *)sr_rel_pos_lf,(ChQuaternion<double> *)&QUNIT);
  std::
  make_shared<chrono::curiosity::CuriosityUpright,char_const(&)[11],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            ((char (*) [11])&local_100,(ChFrame<double> *)"upright_FL",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_b8);
  std::__shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2> *)
             &this->m_rocker_uprights,&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  ChFrame<double>::ChFrame(&local_b8,(ChVector<double> *)&sr_rel_pos_rf,&steer_rot);
  std::
  make_shared<chrono::curiosity::CuriosityUpright,char_const(&)[11],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            ((char (*) [11])&local_100,(ChFrame<double> *)"upright_FR",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_b8);
  std::__shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_rocker_uprights)._M_elems[1].
              super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>,
             &local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  ChFrame<double>::ChFrame
            (&local_b8,(ChVector<double> *)sr_rel_pos_lb,(ChQuaternion<double> *)&QUNIT);
  std::
  make_shared<chrono::curiosity::CuriosityUpright,char_const(&)[11],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            ((char (*) [11])&local_100,(ChFrame<double> *)"upright_RL",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_b8);
  std::__shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2> *)
             &this->m_bogie_uprights,&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  ChFrame<double>::ChFrame(&local_b8,(ChVector<double> *)&sr_rel_pos_rb,&steer_rot);
  std::
  make_shared<chrono::curiosity::CuriosityUpright,char_const(&)[11],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            ((char (*) [11])&local_100,(ChFrame<double> *)"upright_RR",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_b8);
  std::__shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_bogie_uprights)._M_elems[1].
              super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>,
             &local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  ChFrame<double>::ChFrame
            (&local_b8,(ChVector<double> *)&tr_rel_pos_t,(ChQuaternion<double> *)&QUNIT);
  std::
  make_shared<chrono::curiosity::CuriosityDifferentialBar,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            ((char (*) [9])&local_100,(ChFrame<double> *)"diff bar",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_b8);
  std::__shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>::
  operator=(&(this->m_diff_bar).
             super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>
            ,(__shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>
              *)&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  ChFrame<double>::ChFrame
            (&local_b8,(ChVector<double> *)tr_rel_pos_l,(ChQuaternion<double> *)&QUNIT);
  local_f0 = 0;
  std::
  make_shared<chrono::curiosity::CuriosityDifferentialLink,char_const(&)[12],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((char (*) [12])&local_100,(ChFrame<double> *)"diff link L",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_b8,(int *)__args_3);
  std::__shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>::
  operator=((__shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
             *)&this->m_diff_links,
            (__shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
             *)&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  ChFrame<double>::ChFrame
            (&local_b8,(ChVector<double> *)tr_rel_pos_r,(ChQuaternion<double> *)&QUNIT);
  local_f0 = 1;
  std::
  make_shared<chrono::curiosity::CuriosityDifferentialLink,char_const(&)[12],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((char (*) [12])&local_100,(ChFrame<double> *)"diff link R",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_b8,(int *)__args_3);
  std::__shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>::
  operator=(&(this->m_diff_links)._M_elems[1].
             super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
            ,(__shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
              *)&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x10) {
    std::make_shared<chrono::ChShaft>();
    std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(this->m_drive_shafts)._M_elems[0].
                       super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               lVar1),(__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.coord);
  }
  return;
}

Assistant:

void Curiosity::Create(CuriosityChassisType chassis_type, CuriosityWheelType wheel_type) {
    // create rover chassis
    ChQuaternion<> body_rot;
    m_chassis = chrono_types::make_shared<CuriosityChassis>("chassis", chassis_type, m_default_material);

    // Create 6 Curiosity Rover wheels
    for (int i = 0; i < 6; i++) {
        m_wheels[i] = chrono_types::make_shared<CuriosityWheel>("wheel", ChFrame<>(wheel_pos[i], QUNIT),
                                                                m_wheel_material, wheel_type);
    }
    m_wheels[C_RF]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));
    m_wheels[C_RM]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));
    m_wheels[C_RB]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));

    // Create Curiosity suspension rockers and bogies
    m_rockers[0] = chrono_types::make_shared<CuriosityRocker>(  //
        "rocker_L", ChFrame<>(cr_rel_pos_lf, QUNIT), m_default_material, 0);
    m_rockers[1] = chrono_types::make_shared<CuriosityRocker>(  //
        "rocker_R", ChFrame<>(cr_rel_pos_rf, QUNIT), m_default_material, 1);

    m_bogies[0] = chrono_types::make_shared<CuriosityBogie>(  //
        "bogie_L", ChFrame<>(cr_rel_pos_lb, QUNIT), m_default_material, 0);
    m_bogies[1] = chrono_types::make_shared<CuriosityBogie>(  //
        "bogie_R", ChFrame<>(cr_rel_pos_rb, QUNIT), m_default_material, 1);

    // Create the steering uprights
    ChQuaternion<> steer_rot = Q_from_Euler123(ChVector<double>(0, 0, CH_C_PI));

    m_rocker_uprights[0] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_FL", ChFrame<>(sr_rel_pos_lf, QUNIT), m_default_material);
    m_rocker_uprights[1] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_FR", ChFrame<>(sr_rel_pos_rf, steer_rot), m_default_material);

    m_bogie_uprights[0] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_RL", ChFrame<>(sr_rel_pos_lb, QUNIT), m_default_material);
    m_bogie_uprights[1] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_RR", ChFrame<>(sr_rel_pos_rb, steer_rot), m_default_material);

    // Create the differential components
    m_diff_bar = chrono_types::make_shared<CuriosityDifferentialBar>(  //
        "diff bar", ChFrame<>(tr_rel_pos_t, QUNIT), m_default_material);
    m_diff_links[0] = chrono_types::make_shared<CuriosityDifferentialLink>(  //
        "diff link L", ChFrame<>(tr_rel_pos_l, QUNIT), m_default_material, 0);
    m_diff_links[1] = chrono_types::make_shared<CuriosityDifferentialLink>(  //
        "diff link R", ChFrame<>(tr_rel_pos_r, QUNIT), m_default_material, 1);

    // Create drive shafts
    for (int i = 0; i < 6; i++) {
        m_drive_shafts[i] = chrono_types::make_shared<ChShaft>();
    }
}